

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_distributions.cc
# Opt level: O0

void continuous_dist_test_streamable<trng::powerlaw_dist<double>>(powerlaw_dist<double> *d)

{
  StringRef capturedExpression;
  undefined1 uVar1;
  ExprLhs<bool> EVar2;
  param_type *P;
  powerlaw_dist<double> *in_RDI;
  AssertionHandler catchAssertionHandler;
  powerlaw_dist<double> d_new;
  stringstream str;
  param_type p_new;
  undefined4 in_stack_fffffffffffffd98;
  Flags in_stack_fffffffffffffd9c;
  undefined6 in_stack_fffffffffffffda0;
  undefined1 in_stack_fffffffffffffda6;
  undefined1 in_stack_fffffffffffffda7;
  SourceLineInfo *this;
  AssertionHandler *this_00;
  undefined7 in_stack_fffffffffffffdc0;
  undefined1 in_stack_fffffffffffffdc7;
  ExprLhs<bool> *in_stack_fffffffffffffdc8;
  AssertionHandler *in_stack_fffffffffffffdd0;
  param_type *in_stack_fffffffffffffdd8;
  basic_istream<char,_std::char_traits<char>_> *in_stack_fffffffffffffde0;
  powerlaw_dist<double> local_1c0 [2];
  stringstream local_1a0 [16];
  AssertionHandler local_190 [5];
  param_type local_18;
  powerlaw_dist<double> *local_8;
  
  local_8 = in_RDI;
  trng::powerlaw_dist<double>::param_type::param_type(&local_18);
  std::__cxx11::stringstream::stringstream(local_1a0);
  this_00 = local_190;
  P = trng::powerlaw_dist<double>::param(local_8);
  trng::operator<<((basic_ostream<char,_std::char_traits<char>_> *)
                   CONCAT17(in_stack_fffffffffffffdc7,in_stack_fffffffffffffdc0),P);
  trng::operator>>(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
  trng::powerlaw_dist<double>::powerlaw_dist(local_1c0,&local_18);
  operator____catch_sr
            ((char *)CONCAT17(in_stack_fffffffffffffda7,
                              CONCAT16(in_stack_fffffffffffffda6,in_stack_fffffffffffffda0)),
             CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
  this = (SourceLineInfo *)&stack0xfffffffffffffdd8;
  Catch::SourceLineInfo::SourceLineInfo
            (this,
             "/workspace/llm4binary/github/license_c_cmakelists/rabauke[P]trng4/tests/test_distributions.cc"
             ,0xcd);
  Catch::StringRef::StringRef((StringRef *)this_00,(char *)this);
  capturedExpression.m_size._0_7_ = in_stack_fffffffffffffdc0;
  capturedExpression.m_start = (char *)P;
  capturedExpression.m_size._7_1_ = in_stack_fffffffffffffdc7;
  Catch::AssertionHandler::AssertionHandler
            (this_00,(StringRef *)this,
             (SourceLineInfo *)
             CONCAT17(in_stack_fffffffffffffda7,
                      CONCAT16(in_stack_fffffffffffffda6,in_stack_fffffffffffffda0)),
             capturedExpression,in_stack_fffffffffffffd9c);
  uVar1 = trng::operator==((powerlaw_dist<double> *)
                           CONCAT17(in_stack_fffffffffffffda7,
                                    CONCAT16(in_stack_fffffffffffffda6,in_stack_fffffffffffffda0)),
                           (powerlaw_dist<double> *)
                           CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
  EVar2 = Catch::Decomposer::operator<=
                    ((Decomposer *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98),
                     false);
  Catch::AssertionHandler::handleExpr<bool>(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
  Catch::AssertionHandler::complete
            ((AssertionHandler *)CONCAT17(uVar1,CONCAT16(EVar2.m_lhs,in_stack_fffffffffffffda0)));
  Catch::AssertionHandler::~AssertionHandler
            ((AssertionHandler *)CONCAT17(uVar1,CONCAT16(EVar2.m_lhs,in_stack_fffffffffffffda0)));
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return;
}

Assistant:

void continuous_dist_test_streamable(dist &d) {
  typename dist::param_type p_new;
  std::stringstream str;
  str << d.param();
  str >> p_new;
  dist d_new{p_new};
  REQUIRE((d == d_new));
}